

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::dht_announce_alert::~dht_announce_alert(dht_announce_alert *this)

{
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_announce_alert final : alert
	{
		// internal
		dht_announce_alert(aux::stack_allocator& alloc, address const& i, int p
			, sha1_hash const& ih);

		TORRENT_DEFINE_ALERT(dht_announce_alert, 55)

		static constexpr alert_category_t static_category = alert_category::dht;
		std::string message() const override;

		aux::noexcept_movable<address> ip;
		int port;
		sha1_hash info_hash;
	}